

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example007_random_generator.cpp
# Opt level: O0

bool local_random::generate<unsigned_short,void>(void)

{
  bool bVar1;
  uintwide_t<256U,_unsigned_int,_void,_false> local_a94;
  undefined1 local_a70 [7];
  bool result_is_ok;
  wide_integer_type n;
  result_type local_a30 [10];
  undefined1 local_a10 [8];
  distribution_type distribution;
  random_engine_type generator;
  
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)(distribution.my_params.param_b.values.super_array<unsigned_int,_8UL>.elems + 6));
  math::wide_integer::numeric_limits_uintwide_t_base<256U,_unsigned_int,_void,_false>::min();
  math::wide_integer::numeric_limits_uintwide_t_base<256U,_unsigned_int,_void,_false>::max();
  math::wide_integer::uniform_int_distribution<256U,_unsigned_int,_void,_false>::
  uniform_int_distribution
            ((uniform_int_distribution<256U,_unsigned_int,_void,_false> *)local_a10,local_a30,
             (result_type *)(n.values.super_array<unsigned_int,_8UL>.elems + 6));
  math::wide_integer::uniform_int_distribution<256u,unsigned_int,void,false>::operator()
            ((result_type *)local_a70,
             (uniform_int_distribution<256u,unsigned_int,void,false> *)local_a10,
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)(distribution.my_params.param_b.values.super_array<unsigned_int,_8UL>.elems + 6));
  math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::uintwide_t
            (&local_a94,"0xF258D22D4DB91392B5EE8CB6ABE457F8401F7AC78BC80F1CC96D191CF6F6AEA6");
  bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::operator==
                    ((uintwide_t<256U,_unsigned_int,_void,_false> *)local_a70,&local_a94);
  return bVar1;
}

Assistant:

auto generate() -> bool
  {
    using random_engine_type = std::mersenne_twister_engine<std::uint64_t,
                                                            static_cast<std::size_t>(UINT32_C( 64)),
                                                            static_cast<std::size_t>(UINT32_C(312)),
                                                            static_cast<std::size_t>(UINT32_C(156)),
                                                            static_cast<std::size_t>(UINT32_C( 31)),
                                                            UINT64_C(0xB5026F5AA96619E9),
                                                            static_cast<std::size_t>(UINT32_C( 29)),
                                                            UINT64_C(0x5555555555555555),
                                                            static_cast<std::size_t>(UINT32_C( 17)),
                                                            UINT64_C(0x71D67FFFEDA60000),
                                                            static_cast<std::size_t>(UINT32_C( 37)),
                                                            UINT64_C(0xFFF7EEE000000000),
                                                            static_cast<std::size_t>(UINT32_C( 43)),
                                                            UINT64_C(6364136223846793005)>;

    #if defined(WIDE_INTEGER_NAMESPACE)
    using wide_integer_type  = WIDE_INTEGER_NAMESPACE::math::wide_integer::uintwide_t<static_cast<WIDE_INTEGER_NAMESPACE::math::wide_integer::size_t>(UINT32_C(256)), std::uint32_t, AllocatorType>;
    using distribution_type  = WIDE_INTEGER_NAMESPACE::math::wide_integer::uniform_int_distribution<wide_integer_type::my_width2, typename wide_integer_type::limb_type>;
    #else
    using wide_integer_type  = ::math::wide_integer::uintwide_t<static_cast<math::wide_integer::size_t>(UINT32_C(256)), std::uint32_t, AllocatorType>;
    using distribution_type  = ::math::wide_integer::uniform_int_distribution<wide_integer_type::my_width2, typename wide_integer_type::limb_type>;
    #endif

    // Generate a random number with wide_integer_type having limbs of type LimbType.
    // Purosely use the default seed.
    random_engine_type generator; // NOLINT(cert-msc32-c,cert-msc51-cpp)

    distribution_type distribution { };

    const wide_integer_type n = distribution(generator);

    const auto result_is_ok =
      (n == wide_integer_type("0xF258D22D4DB91392B5EE8CB6ABE457F8401F7AC78BC80F1CC96D191CF6F6AEA6"));

    return result_is_ok;
  }